

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O3

void __thiscall
sf::priv::GlContext::checkSettings(GlContext *this,ContextSettings *requestedSettings)

{
  long lVar1;
  int iVar2;
  GlFunctionPointer p_Var3;
  char *__s1;
  char *__s1_00;
  ostream *poVar4;
  
  p_Var3 = getFunction("glGetString");
  if (p_Var3 == (GlFunctionPointer)0x0) {
    poVar4 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Could not load glGetString function",0x23);
    lVar1 = *(long *)poVar4;
  }
  else {
    __s1 = (char *)(*p_Var3)(0x1f00);
    __s1_00 = (char *)(*p_Var3)(0x1f01);
    if (__s1_00 != (char *)0x0 && __s1 != (char *)0x0) {
      iVar2 = strcmp(__s1,"Microsoft Corporation");
      if (iVar2 == 0) {
        iVar2 = strcmp(__s1_00,"GDI Generic");
        if (iVar2 == 0) {
          poVar4 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,
                     "Warning: Detected \"Microsoft Corporation GDI Generic\" OpenGL implementation"
                     ,0x4b);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          poVar4 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"The current OpenGL implementation is not hardware-accelerated",0x3d);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
      }
    }
    if (((((this->m_settings).attributeFlags == requestedSettings->attributeFlags) &&
         ((int)(requestedSettings->majorVersion * 10 + requestedSettings->minorVersion) <=
          (int)((this->m_settings).majorVersion * 10 + (this->m_settings).minorVersion))) &&
        (requestedSettings->stencilBits <= (this->m_settings).stencilBits)) &&
       (((requestedSettings->antialiasingLevel <= (this->m_settings).antialiasingLevel &&
         (requestedSettings->depthBits <= (this->m_settings).depthBits)) &&
        (((this->m_settings).sRgbCapable != false || (requestedSettings->sRgbCapable != true)))))) {
      return;
    }
    poVar4 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,
               "Warning: The created OpenGL context does not fully meet the settings that were requested"
               ,0x58);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    poVar4 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Requested: version = ",0x15);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; depth bits = ",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; stencil bits = ",0x12);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; AA level = ",0xe);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) | 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; core = ",10);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; debug = ",0xb);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; sRGB = ",10);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    lVar1 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffffe;
    std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    poVar4 = err();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Created: version = ",0x13);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; depth bits = ",0x10);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; stencil bits = ",0x12);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; AA level = ",0xe);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) | 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; core = ",10);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; debug = ",0xb);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ; sRGB = ",10);
    poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
    lVar1 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffffe;
  }
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void GlContext::checkSettings(const ContextSettings& requestedSettings)
{
    // Perform checks to inform the user if they are getting a context they might not have expected

    glGetStringFuncType glGetStringFunc = reinterpret_cast<glGetStringFuncType>(getFunction("glGetString"));

    if (!glGetStringFunc)
    {
        err() << "Could not load glGetString function" << std::endl;

        return;
    }

    // Detect any known non-accelerated implementations and warn
    const char* vendorName = reinterpret_cast<const char*>(glGetStringFunc(GL_VENDOR));
    const char* rendererName = reinterpret_cast<const char*>(glGetStringFunc(GL_RENDERER));

    if (vendorName && rendererName)
    {
        if ((std::strcmp(vendorName, "Microsoft Corporation") == 0) && (std::strcmp(rendererName, "GDI Generic") == 0))
        {
            err() << "Warning: Detected \"Microsoft Corporation GDI Generic\" OpenGL implementation" << std::endl
                  << "The current OpenGL implementation is not hardware-accelerated" << std::endl;
        }
    }

    int version = static_cast<int>(m_settings.majorVersion * 10u + m_settings.minorVersion);
    int requestedVersion = static_cast<int>(requestedSettings.majorVersion * 10u + requestedSettings.minorVersion);

    if ((m_settings.attributeFlags    != requestedSettings.attributeFlags)    ||
        (version                      <  requestedVersion)                    ||
        (m_settings.stencilBits       <  requestedSettings.stencilBits)       ||
        (m_settings.antialiasingLevel <  requestedSettings.antialiasingLevel) ||
        (m_settings.depthBits         <  requestedSettings.depthBits)         ||
        (!m_settings.sRgbCapable      && requestedSettings.sRgbCapable))
    {
        err() << "Warning: The created OpenGL context does not fully meet the settings that were requested" << std::endl;
        err() << "Requested: version = " << requestedSettings.majorVersion << "." << requestedSettings.minorVersion
              << " ; depth bits = " << requestedSettings.depthBits
              << " ; stencil bits = " << requestedSettings.stencilBits
              << " ; AA level = " << requestedSettings.antialiasingLevel
              << std::boolalpha
              << " ; core = " << ((requestedSettings.attributeFlags & ContextSettings::Core) != 0)
              << " ; debug = " << ((requestedSettings.attributeFlags & ContextSettings::Debug) != 0)
              << " ; sRGB = " << requestedSettings.sRgbCapable
              << std::noboolalpha << std::endl;
        err() << "Created: version = " << m_settings.majorVersion << "." << m_settings.minorVersion
              << " ; depth bits = " << m_settings.depthBits
              << " ; stencil bits = " << m_settings.stencilBits
              << " ; AA level = " << m_settings.antialiasingLevel
              << std::boolalpha
              << " ; core = " << ((m_settings.attributeFlags & ContextSettings::Core) != 0)
              << " ; debug = " << ((m_settings.attributeFlags & ContextSettings::Debug) != 0)
              << " ; sRGB = " << m_settings.sRgbCapable
              << std::noboolalpha << std::endl;
    }
}